

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_abstractstringserialiser.cpp
# Opt level: O2

int __thiscall
AbstractStringSerialiser::qt_metacall(AbstractStringSerialiser *this,Call _c,int _id,void **_a)

{
  uint _id_00;
  
  _id_00 = AbstractModelSerialiser::qt_metacall(&this->super_AbstractModelSerialiser,_c,_id,_a);
  if (-1 < (int)_id_00) {
    if (_c == RegisterMethodArgumentMetaType) {
      if (_id_00 < 3) {
        *(undefined8 *)*_a = 0;
      }
    }
    else {
      if (_c != InvokeMetaMethod) {
        return _id_00;
      }
      if (_id_00 < 3) {
        qt_static_metacall((QObject *)this,InvokeMetaMethod,_id_00,_a);
      }
    }
    _id_00 = _id_00 - 3;
  }
  return _id_00;
}

Assistant:

int AbstractStringSerialiser::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = AbstractModelSerialiser::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 3)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 3;
    } else if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 3)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 3;
    }
    return _id;
}